

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

void __thiscall MADPComponentDiscreteStates::SetUniformISD(MADPComponentDiscreteStates *this)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  reference pdVar4;
  MADPComponentDiscreteStates *in_RDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  iterator last;
  iterator it;
  double uprob;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  auVar5 = in_ZMM0._0_16_;
  if ((in_RDI->_m_initialized & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             " MADPComponentDiscreteStates::SetUniformISD - ERROR can\'t");
    std::operator<<(poVar2,
                    "set uniform init. state distr., when not initialized! (don\'t know how many state yet...)"
                   );
  }
  else {
    sVar3 = GetNrStates(in_RDI);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar3);
    local_10 = (vector<double,_std::allocator<double>_> *)(1.0 / auVar5._0_8_);
    local_18._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffc8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_RDI,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 = local_10;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_18);
      *pdVar4 = (double)in_stack_ffffffffffffffc8;
      in_stack_ffffffffffffffd8 =
           __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator++(in_stack_ffffffffffffffd8._M_current,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetUniformISD()
{
    //cout << " MADPComponentDiscreteStates::SetUniformISD called"<<endl;
    if(!_m_initialized)
    {
        cout << " MADPComponentDiscreteStates::SetUniformISD - ERROR can't"<<
            "set uniform init. state distr., when not initialized! (don't know how many state yet...)";
        return;
    }
    double uprob = 1.0 / GetNrStates();
    vector<double>::iterator it = _m_initialStateDistribution->begin();
    vector<double>::iterator last = _m_initialStateDistribution->end();
    while(it!=last)
    {
        *it = uprob;
        it++;
    }
}